

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_sequence.hpp
# Opt level: O1

bool jessilib::hex_shrink_sequence_action<char8_t,2ul,false,false>
               (char8_t **in_write_head,
               basic_string_view<char8_t,_std::char_traits<char8_t>_> *read_view)

{
  size_t sVar1;
  char8_t *pcVar2;
  char8_t cVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  sVar1 = read_view->_M_len;
  uVar5 = 0;
  cVar3 = '\0';
  if (sVar1 == 0) {
    lVar8 = 0;
  }
  else {
    lVar7 = (ulong)(sVar1 != 1) + 1;
    lVar6 = 0;
    do {
      cVar3 = (char8_t)uVar5;
      lVar8 = (long)read_view->_M_str[lVar6];
      uVar4 = 0xffffffff;
      if ((-1 < lVar8) && (uVar4 = (uint)(byte)base_table[lVar8], 0xf < uVar4)) {
        uVar4 = 0xffffffff;
      }
      lVar8 = lVar6;
      if ((int)uVar4 < 0) break;
      uVar5 = uVar4 | uVar5 << 4;
      cVar3 = (char8_t)uVar5;
      lVar6 = lVar6 + 1;
      lVar8 = lVar7;
    } while (lVar7 != lVar6);
  }
  if (lVar8 != 0) {
    read_view->_M_str = read_view->_M_str + lVar8;
    read_view->_M_len = sVar1 - lVar8;
    pcVar2 = *in_write_head;
    *pcVar2 = cVar3;
    *in_write_head = pcVar2 + 1;
  }
  return lVar8 != 0;
}

Assistant:

constexpr bool hex_shrink_sequence_action(CharT*& in_write_head, std::basic_string_view<CharT>& read_view) {
	// Does not modify
	auto read_hex = [](uint32_t& out_value, std::basic_string_view<CharT> in_view, size_t max_digits) constexpr {
		size_t result{};
		int hex_value;
		out_value = 0;
		while (result != max_digits
			&& !in_view.empty()) {
			hex_value = as_base(in_view.front(), 16); // hexadecimal characters are always 1 unit
			if (hex_value < 0) {
				// Not a hexadecimal character; push what we have and handle this
				return result;
			}

			out_value <<= 4;
			out_value |= hex_value;

			in_view.remove_prefix(1);
			++result;
		}

		// Number of elements that are hexadecimal digits
		return result;
	};

	// Read in hex value
	uint32_t hex_value;
	size_t units_read = read_hex(hex_value, read_view, MaxDigitsV);

	// Sanity check digits read
	if constexpr(ExactDigitsV) {
		if (units_read != MaxDigitsV) {
			// We expected example MaxDigitsV digits; fail
			return false;
		}
	}
	else {
		if (units_read == 0) {
			// We didn't read any digits; fail
			return false;
		}
	}

	// We read an acceptable number of digits; write the unit and call it a day
	read_view.remove_prefix(units_read);
	if constexpr (IsUnicode) {
		in_write_head += encode_codepoint(in_write_head, hex_value);
	}
	else {
		static_assert(MaxDigitsV <= sizeof(CharT) * 2);
		*in_write_head = static_cast<CharT>(hex_value);
		++in_write_head;
	}

	return true;
}